

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestFailure.cpp
# Opt level: O0

void __thiscall
DoublesEqualFailure::DoublesEqualFailure
          (DoublesEqualFailure *this,UtestShell *test,char *fileName,size_t lineNumber,
          double expected,double actual,double threshold,SimpleString *text)

{
  int iVar1;
  SimpleString *in_RDI;
  double in_XMM0_Qa;
  double in_XMM1_Qa;
  double in_XMM2_Qa;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  undefined4 in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff54;
  SimpleString *in_stack_ffffffffffffff60;
  TestFailure *in_stack_ffffffffffffff68;
  SimpleString *in_stack_ffffffffffffff70;
  size_t in_stack_ffffffffffffff88;
  SimpleString *in_stack_ffffffffffffff90;
  TestFailure *in_stack_ffffffffffffff98;
  TestFailure *in_stack_ffffffffffffffa0;
  
  TestFailure::TestFailure
            (in_stack_ffffffffffffffa0,(UtestShell *)in_stack_ffffffffffffff98,
             (char *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  in_RDI->buffer_ = (char *)&PTR__DoublesEqualFailure_001c4888;
  TestFailure::createUserText(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  SimpleString::operator=
            ((SimpleString *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
             (SimpleString *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  SimpleString::~SimpleString((SimpleString *)0x179e50);
  StringFrom((double)in_RDI,in_stack_ffffffffffffff54);
  StringFrom((double)in_RDI,in_stack_ffffffffffffff54);
  TestFailure::createButWasString(in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,in_RDI);
  SimpleString::operator+=
            ((SimpleString *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
             (SimpleString *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  SimpleString::~SimpleString((SimpleString *)0x179ebe);
  SimpleString::~SimpleString((SimpleString *)0x179ec8);
  SimpleString::~SimpleString((SimpleString *)0x179ed2);
  SimpleString::operator+=(in_stack_ffffffffffffff70,(char *)in_stack_ffffffffffffff68);
  StringFrom((double)in_RDI,in_stack_ffffffffffffff54);
  SimpleString::operator+=
            ((SimpleString *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
             (SimpleString *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  SimpleString::~SimpleString((SimpleString *)0x179f22);
  SimpleString::operator+=(in_stack_ffffffffffffff70,(char *)in_stack_ffffffffffffff68);
  iVar1 = (*PlatformSpecificIsNan)(in_XMM0_Qa);
  if (((iVar1 == 0) && (iVar1 = (*PlatformSpecificIsNan)(in_XMM1_Qa), iVar1 == 0)) &&
     (iVar1 = (*PlatformSpecificIsNan)(in_XMM2_Qa), iVar1 == 0)) {
    return;
  }
  SimpleString::operator+=(in_stack_ffffffffffffff70,(char *)in_stack_ffffffffffffff68);
  return;
}

Assistant:

DoublesEqualFailure::DoublesEqualFailure(UtestShell* test, const char* fileName, size_t lineNumber, double expected, double actual, double threshold, const SimpleString& text)
: TestFailure(test, fileName, lineNumber)
{
    message_ = createUserText(text);

    message_ += createButWasString(StringFrom(expected, 7), StringFrom(actual, 7));
    message_ += " threshold used was <";
    message_ += StringFrom(threshold, 7);
    message_ += ">";

    if (PlatformSpecificIsNan(expected) || PlatformSpecificIsNan(actual) || PlatformSpecificIsNan(threshold))
        message_ += "\n\tCannot make comparisons with Nan";
}